

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

int __thiscall duckdb_re2::Regexp::Ref(Regexp *this)

{
  uint *puVar1;
  uint uVar2;
  MutexLock l;
  MutexLock local_20;
  Regexp *local_18;
  
  uVar2 = (uint)this->ref_;
  if (this->ref_ == 0xffff) {
    MutexLock::MutexLock(&local_20,(Mutex *)ref_storage);
    local_18 = this;
    puVar1 = (uint *)std::
                     map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
                     ::operator[]((map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
                                   *)(ref_storage + 0x38),&local_18);
    uVar2 = *puVar1;
    MutexLock::~MutexLock(&local_20);
  }
  return uVar2;
}

Assistant:

int Regexp::Ref() {
  if (ref_ < kMaxRef)
    return ref_;

  MutexLock l(ref_mutex());
  return (*ref_map())[this];
}